

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  Split *pSVar2;
  char *pcVar3;
  pointer *pppTVar4;
  float fVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  BBox1f BVar11;
  MemoryMonitorInterface *pMVar12;
  BBox1f BVar13;
  BBox1f BVar14;
  ThreadLocal2 *pTVar15;
  iterator iVar16;
  InstanceArray *pIVar17;
  BBox1f *pBVar18;
  Scene *pSVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Vec3fa VVar34;
  undefined8 uVar35;
  vint *pvVar36;
  BBox1f BVar37;
  undefined8 uVar38;
  byte bVar39;
  char cVar40;
  long lVar41;
  long lVar42;
  SetMB *this_00;
  void *pvVar43;
  ulong uVar44;
  float *pfVar45;
  size_t sVar46;
  undefined8 *puVar47;
  runtime_error *prVar48;
  BBox1f *pBVar49;
  uint *puVar50;
  byte bVar51;
  char *pcVar52;
  ulong uVar53;
  pointer *__ptr;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  mvector<PrimRefMB> *prims;
  BuildRecord *in_00;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar77;
  undefined1 auVar78 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar79;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e08 [16];
  undefined1 local_1df8 [16];
  undefined1 local_1dc8 [16];
  undefined1 local_1db8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  LBBox3fa lbbox_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  BBox1f local_1bc8;
  size_t sStack_1bc0;
  size_t sStack_1bb8;
  BBox1f BStack_1bb0;
  BBox1f local_1ba8;
  BBox1f BStack_1ba0;
  size_t sStack_1b98;
  size_t sStack_1b90;
  undefined1 auStack_1b88 [16];
  BBox1f local_1b78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1af8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  BBox1f local_1aa8;
  BBox1f BStack_1aa0;
  size_t sStack_1a98;
  size_t sStack_1a90;
  undefined1 auStack_1a88 [16];
  BBox1f local_1a78;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  undefined8 local_1878;
  undefined8 uStack_1870;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1868;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1858;
  BBox1f local_1848;
  BBox1f BStack_1840;
  size_t sStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  BBox1f BStack_1820;
  BBox1f local_1818;
  undefined8 local_1808;
  uint uStack_17fc;
  undefined8 local_17f8;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 auStack_17d8 [8];
  undefined1 auStack_17d0 [8];
  LBBox3fa lbbox;
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  BBox1f local_1758 [2];
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar44 = in->depth;
  if ((this->cfg).maxDepth < uVar44) {
    puVar47 = (undefined8 *)__cxa_allocate_exception(0x30);
    lbbox.bounds0.lower.field_0._0_8_ = &lbbox.bounds0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lbbox,"depth limit reached","");
    *puVar47 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar47 + 1) = 1;
    puVar47[2] = puVar47 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar47 + 2),lbbox.bounds0.lower.field_0._0_8_,
               CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_) +
               lbbox.bounds0.lower.field_0._0_8_);
    __cxa_throw(puVar47,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar6 = *(undefined8 *)
           &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.lower.field_0;
  uVar21 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  uVar22 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar23 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar77 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  uVar24 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar25 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  aVar76 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar72 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar11 = (BBox1f)(in->prims).prims;
  BVar13 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar14 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&lbbox,this,&in->prims);
  local_1718[0].mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  local_1718[0].mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  uVar35 = lbbox.bounds0.lower.field_0._0_8_;
  local_18a8 = uVar6;
  uStack_18a0 = uVar21;
  local_1898 = uVar22;
  uStack_1890 = uVar23;
  local_1888 = aVar77;
  local_1878 = uVar24;
  uStack_1870 = uVar25;
  local_1868 = aVar76;
  local_1858 = aVar72;
  local_1848 = BVar13;
  BStack_1840 = BVar14;
  sStack_1838 = values[0].ref.ptr;
  uStack_1830 = values[0]._8_8_;
  uStack_1828 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1820.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar37 = BStack_1820;
  local_1818 = BVar11;
  local_1808 = lbbox.bounds0.lower.field_0._0_8_;
  local_17f8 = lbbox.bounds0.upper.field_0._0_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
  local_17e8 = lbbox.bounds1.lower.field_0._0_8_;
  uStack_17e0 = lbbox.bounds1.lower.field_0._8_8_;
  auStack_17d8 = (undefined1  [8])lbbox.bounds1.upper.field_0._0_8_;
  auStack_17d0 = (undefined1  [8])lbbox.bounds1.upper.field_0._8_8_;
  if ((uVar44 == 1) && (BVar14 != BVar13)) {
    BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1820.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar41 = (long)BVar14 - (long)BVar13;
    if ((ulong)BVar14 < (ulong)BVar13 || lVar41 == 0) {
      auVar59 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar49 = &(*(PrimRefMB **)((long)BVar11 + 0x20))[(long)BVar13].time_range;
      auVar59 = ZEXT816(0xff8000007f800000);
      do {
        auVar73._8_8_ = 0;
        auVar73._0_4_ = pBVar49->lower;
        auVar73._4_4_ = pBVar49->upper;
        auVar61 = vcmpps_avx(auVar59,auVar73,1);
        auVar60 = vinsertps_avx(auVar59,auVar73,0x50);
        auVar59 = vblendps_avx(auVar73,auVar59,2);
        auVar59 = vblendvps_avx(auVar59,auVar60,auVar61);
        pBVar49 = pBVar49 + 10;
        lVar41 = lVar41 + -1;
      } while (lVar41 != 0);
    }
    auVar61 = vmovshdup_avx(auVar59);
    auVar61 = vcmpps_avx(auVar61,ZEXT416((uint)BStack_1820.upper),1);
    auVar59 = vcmpps_avx(ZEXT416((uint)BStack_1820.lower),auVar59,1);
    auVar59 = vorps_avx(auVar59,auVar61);
    bVar51 = auVar59[0] & 1;
  }
  else {
    bVar51 = 0;
  }
  uVar56 = (long)BVar14 - (long)BVar13;
  BStack_1820 = BVar37;
  if (((uVar56 <= (this->cfg).maxLeafSize) &&
      (uStack_17fc = (uint)((uint7)lbbox.bounds0.lower.field_0._9_7_ >> 0x18), uStack_17fc < 2)) &&
     (bVar51 == 0)) {
    local_1b18._0_8_ = uVar56 * 8;
    pTVar15 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar15->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar15;
      MutexSys::lock(&pTVar15->mutex);
      if ((pTVar15->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar15->alloc1).bytesUsed + (pTVar15->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar15->alloc0).end + (pTVar15->alloc1).end) -
             ((pTVar15->alloc0).cur + (pTVar15->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar15->alloc1).bytesWasted + (pTVar15->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar15->alloc0).end = auVar63._0_8_;
      (pTVar15->alloc0).allocBlockSize = auVar63._8_8_;
      (pTVar15->alloc0).bytesUsed = auVar63._16_8_;
      (pTVar15->alloc0).bytesWasted = auVar63._24_8_;
      (pTVar15->alloc0).ptr = (char *)auVar63._0_8_;
      (pTVar15->alloc0).cur = auVar63._8_8_;
      (pTVar15->alloc0).end = auVar63._16_8_;
      (pTVar15->alloc0).allocBlockSize = auVar63._24_8_;
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar15->alloc1).end = auVar63._0_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar15->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar15->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar15->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar15->alloc1).cur = auVar63._8_8_;
        (pTVar15->alloc1).end = auVar63._16_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._24_8_;
      }
      else {
        (pTVar15->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar15->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar15->alloc1).cur = auVar63._8_8_;
        (pTVar15->alloc1).end = auVar63._16_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._24_8_;
        (pTVar15->alloc1).end = auVar63._0_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar15->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar15->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar15->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar15->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox.bounds0.lower.field_0._8_1_ = 1;
      lbbox_1.bounds0.lower.field_0._0_8_ = pTVar15;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar16._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar16._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar16,(ThreadLocal2 **)&lbbox_1);
      }
      else {
        *iVar16._M_current = (ThreadLocal2 *)lbbox_1.bounds0.lower.field_0._0_8_;
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (lbbox.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox.bounds0.lower.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_1b18._0_8_;
    sVar46 = (alloc.talloc1)->cur;
    uVar44 = (ulong)(-(int)sVar46 & 0x1f);
    uVar53 = sVar46 + local_1b18._0_8_ + uVar44;
    (alloc.talloc1)->cur = uVar53;
    if ((alloc.talloc1)->end < uVar53) {
      (alloc.talloc1)->cur = sVar46;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(local_1b18._0_8_ << 2)) {
        pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1b18);
      }
      else {
        lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
        (alloc.talloc1)->ptr = pcVar52;
        sVar46 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar46;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = local_1b18._0_8_;
        if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
          (alloc.talloc1)->cur = 0;
          lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
          (alloc.talloc1)->ptr = pcVar52;
          sVar46 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar46;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = local_1b18._0_8_;
          if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar52 = (char *)0x0;
            goto LAB_01454e3c;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar46;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar44;
      pcVar52 = (alloc.talloc1)->ptr + (uVar53 - local_1b18._0_8_);
    }
LAB_01454e3c:
    uVar44 = 7;
    if (uVar56 < 7) {
      uVar44 = uVar56;
    }
    if (BVar14 == BVar13) {
      aVar77.m128[2] = -INFINITY;
      aVar77._0_8_ = 0xff800000ff800000;
      aVar77.m128[3] = -INFINITY;
      aVar80.m128[2] = INFINITY;
      aVar80._0_8_ = 0x7f8000007f800000;
      aVar80.m128[3] = INFINITY;
      aVar69 = aVar80;
      aVar72 = aVar77;
    }
    else {
      lVar41 = (long)BVar13 * 10;
      aVar69.m128[2] = INFINITY;
      aVar69._0_8_ = 0x7f8000007f800000;
      aVar69.m128[3] = INFINITY;
      aVar72.m128[2] = -INFINITY;
      aVar72._0_8_ = 0xff800000ff800000;
      aVar72.m128[3] = -INFINITY;
      uVar53 = 0;
      aVar77 = aVar72;
      aVar80 = aVar69;
      do {
        pSVar19 = ((this->createLeaf).bvh)->scene;
        values[0].ref.ptr._0_4_ = BStack_1820.lower;
        values[0].ref.ptr._4_4_ = BStack_1820.upper;
        uVar9 = *(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).bounds0.lower
                                 .field_0 + lVar41 * 8 + 0xc);
        uVar10 = *(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).bounds0.
                                  upper.field_0 + lVar41 * 8 + 0xc);
        *(uint *)(pcVar52 + uVar53 * 8) = uVar10;
        *(uint *)(pcVar52 + uVar53 * 8 + 4) = uVar9;
        pIVar17 = (InstanceArray *)(pSVar19->geometries).items[uVar9].ptr;
        if ((*(long *)&(pIVar17->super_Geometry).field_0x58 != 0) ||
           (*(int *)((pIVar17->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar17->object_ids).super_RawBufferView.stride * (ulong)uVar10) != -1)) {
          InstanceArray::nonlinearBounds
                    (&lbbox,pIVar17,(ulong)uVar10,(BBox1f *)values,
                     &(pIVar17->super_Geometry).time_range,
                     (pIVar17->super_Geometry).fnumTimeSegments);
        }
        auVar31[8] = lbbox.bounds0.lower.field_0._8_1_;
        auVar31._0_8_ = lbbox.bounds0.lower.field_0._0_8_;
        auVar31._9_7_ = lbbox.bounds0.lower.field_0._9_7_;
        aVar80.m128 = (__m128)vminps_avx(aVar80.m128,auVar31);
        auVar32._8_8_ = lbbox.bounds0.upper.field_0._8_8_;
        auVar32._0_8_ = lbbox.bounds0.upper.field_0._0_8_;
        aVar77.m128 = (__m128)vmaxps_avx(aVar77.m128,auVar32);
        auVar33._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
        auVar33._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
        aVar69.m128 = (__m128)vminps_avx(aVar69.m128,auVar33);
        aVar72.m128 = (__m128)vmaxps_avx(aVar72.m128,lbbox.bounds1.upper.field_0);
        uVar53 = uVar53 + 1;
        lVar41 = lVar41 + 10;
      } while (uVar56 != uVar53);
    }
    (__return_storage_ptr__->ref).ptr = uVar44 | (ulong)pcVar52 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar80;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar77;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar69;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar72;
    __return_storage_ptr__->dt = BStack_1820;
    return __return_storage_ptr__;
  }
  lVar41 = 0xbc;
  do {
    *(undefined8 *)(auStack_17d8 + lVar41 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(auStack_17d0 + lVar41 + 4) = 0;
    lVar41 = lVar41 + 0xf0;
  } while (lVar41 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  lbbox.bounds0.lower.field_0._0_8_ = uVar44;
  uVar38 = lbbox.bounds0.lower.field_0._0_8_;
  lbbox.bounds0.upper.field_0._0_8_ = uVar6;
  lbbox.bounds0.upper.field_0._8_8_ = uVar21;
  lbbox.bounds1.lower.field_0._0_8_ = uVar22;
  lbbox.bounds1.lower.field_0._8_8_ = uVar23;
  lbbox.bounds1.upper.field_0 = aVar77;
  local_1788._0_8_ = uVar24;
  local_1788._8_8_ = uVar25;
  local_1778 = aVar76;
  local_1768 = (undefined1  [16])aVar72;
  local_1758[0] = BVar13;
  local_1758[1] = BVar14;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar11;
  lbbox.bounds0.lower.field_0._0_4_ = (undefined4)uVar35;
  lbbox.bounds0.lower.field_0._4_4_ = SUB84(uVar35,4);
  local_1718[0].sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  local_1718[0].dim = lbbox.bounds0.lower.field_0._4_4_;
  local_840 = BVar11;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1db8._8_4_ = 0x7f800000;
  local_1db8._0_8_ = 0x7f8000007f800000;
  local_1db8._12_4_ = 0x7f800000;
  local_1dc8._8_4_ = 0xff800000;
  local_1dc8._0_8_ = 0xff800000ff800000;
  local_1dc8._12_4_ = 0xff800000;
  bVar39 = 0;
  lbbox.bounds0.lower.field_0._0_8_ = uVar38;
  do {
    if (local_848 == 0) {
      uVar56 = 0xffffffffffffffff;
    }
    else {
      uVar56 = 0xffffffffffffffff;
      pBVar49 = local_1758;
      uVar53 = 0;
      uVar54 = 0;
      do {
        uVar55 = (long)pBVar49[1] - (long)*pBVar49;
        if ((((this->cfg).maxLeafSize < uVar55) || (1 < (uint)pBVar49[9].upper)) || (bVar51 != 0)) {
          if (uVar53 < uVar55) {
            uVar56 = uVar54;
            uVar53 = uVar55;
          }
          bVar51 = 0;
        }
        uVar54 = uVar54 + 1;
        pBVar49 = pBVar49 + 0x1e;
      } while (local_848 != uVar54);
    }
    if (uVar56 != 0xffffffffffffffff) {
      lVar41 = uVar56 * 0xf0;
      lbbox_1.bounds0.lower.field_0._0_8_ = uVar44 + 1;
      local_1b18._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
      local_1a68 = 0xffffffff7f800000;
      uStack_1a60 = 0;
      pSVar2 = (Split *)((long)local_1718 + lVar41);
      iVar7 = *(int *)((long)local_1718 + lVar41 + 0xc);
      if (iVar7 == 0) {
        local_1ba8 = local_1758[uVar56 * 0x1e];
        BVar11 = local_1758[uVar56 * 0x1e + 1];
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        left.max_time_range.lower = 0.0;
        left.object_range._begin = 0;
        left.object_range._end = 0;
        left.num_time_segments = 0;
        left.max_num_time_segments = 0;
        auVar74._8_4_ = 0x3f800000;
        auVar74._0_8_ = &DAT_3f8000003f800000;
        auVar74._12_4_ = 0x3f800000;
        uVar6 = vmovlps_avx(auVar74);
        left.max_time_range.upper = (float)uVar6;
        left.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        left.time_range.upper = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar6 = vmovlps_avx(auVar74);
        right.max_time_range.upper = (float)uVar6;
        right.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar41 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar42 = (long)(1 << (*(byte *)((long)local_1718 + lVar41 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar42);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar42 + 8);
        isLeft.split = pSVar2;
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        BStack_1ba0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1728[uVar56 * 0x1e] + 0x20),
                                         (size_t)local_1ba8,(size_t)BVar11,(EmptyTy *)local_19d8,
                                         &left,&right,&isLeft,&reduction,&reduction2,0x80,0xc00);
        local_1b78 = local_1728[uVar56 * 0x1e];
        auVar58._8_8_ = 0;
        auVar58._0_4_ = local_1728[uVar56 * 0x1e + -1].lower;
        auVar58._4_4_ = local_1728[uVar56 * 0x1e + -1].upper;
        local_1bc8.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bc8.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        sStack_1bc0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[3],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[2]);
        sStack_1bb8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[1],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[0]);
        BStack_1bb0.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
        BStack_1bb0.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1bd8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        aStack_1bd8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        sStack_1b98 = left.num_time_segments;
        sStack_1b90 = left.max_num_time_segments;
        auStack_1b88._0_8_ = CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
        auStack_1b88._8_8_ = SUB168(auStack_1b88,8);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = auStack_1b88._8_8_;
        auVar59 = vcmpps_avx(auVar64,auVar58,1);
        auVar61 = vinsertps_avx(auVar58,auVar64,0x50);
        auVar60 = vinsertps_avx(auVar64,auVar58,0x50);
        auVar59 = vblendvps_avx(auVar60,auVar61,auVar59);
        uVar6 = vmovlps_avx(auVar59);
        auStack_1b88._0_8_ = SUB168(auStack_1b88,0);
        auStack_1b88._8_8_ = uVar6;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        aStack_1af8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        aStack_1af8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        aStack_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1ae8.m128[1] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1ae8.m128[0] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1ae8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1ae8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a98 = right.num_time_segments;
        sStack_1a90 = right.max_num_time_segments;
        auStack_1a88._0_8_ = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        auStack_1a88._8_8_ = SUB168(auStack_1a88,8);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = auStack_1a88._8_8_;
        auVar59 = vcmpps_avx(auVar65,auVar58,1);
        auVar61 = vinsertps_avx(auVar58,auVar65,0x50);
        auVar60 = vinsertps_avx(auVar65,auVar58,0x50);
        auVar59 = vblendvps_avx(auVar60,auVar61,auVar59);
        uVar6 = vmovlps_avx(auVar59);
        auStack_1a88._0_8_ = SUB168(auStack_1a88,0);
        auStack_1a88._8_8_ = uVar6;
        local_1aa8 = BStack_1ba0;
        BStack_1aa0 = BVar11;
        local_1a78 = local_1b78;
LAB_01453524:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = (SetMB *)((long)&lbbox + lVar41 + 0x10);
        if (iVar7 != 2) {
          if (iVar7 == 1) {
            SetMB::deterministic_order(this_00);
            splitFallback(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,(SetMB *)&local_1b08.field_1)
            ;
          }
          else if (iVar7 == 3) {
            SetMB::deterministic_order(this_00);
            splitByGeometry(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,
                            (SetMB *)&local_1b08.field_1);
          }
          goto LAB_01453524;
        }
        time_range1.lower = *(float *)((long)local_1718 + lVar41 + 8);
        time_range0.lower = local_1728[uVar56 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar56 * 0x1e + -1].upper;
        BVar11 = local_1728[uVar56 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1b78 = (BBox1f)operator_new(0x28);
        pMVar12 = (this->heuristicTemporalSplit).device;
        BVar13 = local_1758[uVar56 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1b78 = pMVar12;
        *(undefined1 *)((long)local_1b78 + 8) = 0;
        *(long *)((long)local_1b78 + 0x10) = 0;
        *(long *)((long)local_1b78 + 0x18) = 0;
        *(long *)((long)local_1b78 + 0x20) = 0;
        lVar42 = (long)BVar13 - (long)local_1758[uVar56 * 0x1e];
        if (lVar42 != 0) {
          uVar53 = lVar42 * 0x50;
          (**pMVar12->_vptr_MemoryMonitorInterface)(pMVar12,uVar53,0);
          if (uVar53 < 0x1c00000) {
            pvVar43 = alignedMalloc(uVar53,0x10);
          }
          else {
            pvVar43 = os_malloc(uVar53,(bool *)((long)local_1b78 + 8));
          }
          *(void **)((long)local_1b78 + 0x20) = pvVar43;
          *(long *)((long)local_1b78 + 0x10) = lVar42;
          *(long *)((long)local_1b78 + 0x18) = lVar42;
        }
        pvVar36 = isLeft.vSplitPos;
        vSplitMask.field_0._0_4_ = BVar11.lower;
        vSplitMask.field_0._4_4_ = BVar11.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        BVar13 = local_1758[uVar56 * 0x1e];
        BVar14 = local_1758[uVar56 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar59._8_4_ = 0x3f800000;
        auVar59._0_8_ = &DAT_3f8000003f800000;
        auVar59._12_4_ = 0x3f800000;
        uVar6 = vmovlps_avx(auVar59);
        right.max_time_range.upper = (float)uVar6;
        right.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1b78;
        if ((ulong)((long)BVar14 - (long)BVar13) < 0xc00) {
          isLeft.split = (Split *)BVar13;
          isLeft.vSplitPos = (vint *)BVar14;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar36,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)BVar14;
          vSplitPos.field_0.v[1] = (longlong)BVar13;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar40 != '\0') {
            prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar48,"task cancelled");
            __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (left.object_range._end - left.object_range._begin !=
            (long)local_1758[uVar56 * 0x1e + 1] - (long)local_1758[uVar56 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          left.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                         (*(PrimRefMB **)((long)local_1b78 + 0x20),0,
                          (long)local_1758[uVar56 * 0x1e + 1] - (long)local_1758[uVar56 * 0x1e],
                          0x400,(anon_class_8_1_41ce32a5 *)&right);
        }
        uVar6 = vSplitPos.field_0.v[1];
        auVar60._4_4_ = time_range0.upper;
        auVar60._0_4_ = time_range0.lower;
        auVar60._8_8_ = 0;
        local_1bc8.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bc8.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        sStack_1bc0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[3],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[2]);
        sStack_1bb8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[1],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[0]);
        BStack_1bb0.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
        BStack_1bb0.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
        sStack_1b98 = left.num_time_segments;
        sStack_1b90 = left.max_num_time_segments;
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1bd8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        aStack_1bd8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1ba8.lower = (float)(undefined4)left.object_range._begin;
        local_1ba8.upper = (float)left.object_range._begin._4_4_;
        BStack_1ba0.lower = (float)(undefined4)left.object_range._end;
        BStack_1ba0.upper = (float)left.object_range._end._4_4_;
        auVar66._4_4_ = left.max_time_range.upper;
        auVar66._0_4_ = left.max_time_range.lower;
        auVar66._8_8_ = 0;
        auVar70._4_4_ = left.time_range.upper;
        auVar70._0_4_ = left.time_range.lower;
        auVar70._8_8_ = 0;
        auVar59 = vcmpps_avx(auVar70,auVar60,1);
        auVar61 = vinsertps_avx(auVar60,auVar70,0x50);
        auVar60 = vinsertps_avx(auVar70,auVar60,0x50);
        auVar59 = vblendvps_avx(auVar60,auVar61,auVar59);
        auStack_1b88 = vmovlhps_avx(auVar66,auVar59);
        BVar13 = local_1758[uVar56 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar61._8_4_ = 0x3f800000;
        auVar61._0_8_ = &DAT_3f8000003f800000;
        auVar61._12_4_ = 0x3f800000;
        vmovlps_avx(auVar61);
        _reduction2 = BVar11;
        if ((ulong)((long)BVar13 - (long)local_1758[uVar56 * 0x1e]) < 0xc00) {
          vSplitPos.field_0.v[0] = (longlong)local_1758[uVar56 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)BVar13;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar6,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19d8._8_8_ = &reduction2;
          _reduction = (code *)BVar13;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar40 != '\0') {
            prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar48,"task cancelled");
            __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar42 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1758 + uVar56 * 0x1e);
        right.object_range._end = lVar42 + right.object_range._begin;
        if (lVar42 != (long)local_1758[uVar56 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar11 + 0x20),right.object_range._begin,
                          (unsigned_long)local_1758[uVar56 * 0x1e + 1],0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar62._4_4_ = time_range1.upper;
        auVar62._0_4_ = time_range1.lower;
        auVar62._8_8_ = 0;
        aStack_1af8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        aStack_1af8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        local_1ae8.m128[1] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1ae8.m128[0] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1ae8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1ae8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a90 = right.max_num_time_segments;
        sStack_1a98 = right.num_time_segments;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        aStack_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1aa8.lower = (float)(undefined4)right.object_range._begin;
        local_1aa8.upper = (float)right.object_range._begin._4_4_;
        BStack_1aa0.lower = (float)(undefined4)right.object_range._end;
        BStack_1aa0.upper = (float)right.object_range._end._4_4_;
        auVar67._4_4_ = right.time_range.upper;
        auVar67._0_4_ = right.time_range.lower;
        auVar67._8_8_ = 0;
        auVar59 = vcmpps_avx(auVar67,auVar62,1);
        auVar61 = vinsertps_avx(auVar62,auVar67,0x50);
        auVar60 = vinsertps_avx(auVar67,auVar62,0x50);
        auVar59 = vblendvps_avx(auVar60,auVar61,auVar59);
        auVar68._4_4_ = right.max_time_range.upper;
        auVar68._0_4_ = right.max_time_range.lower;
        auVar68._8_8_ = 0;
        auStack_1a88 = vmovlhps_avx(auVar68,auVar59);
        local_1a78 = BVar11;
      }
      auVar59 = auStack_1b88;
      bVar57 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&left,this,(SetMB *)&lbbox_1.bounds0.upper);
      uVar6 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_;
      uVar21 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               _8_8_;
      uVar22 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
               _0_8_;
      uVar23 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _0_8_;
      uVar24 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _8_8_;
      uVar25 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _0_8_;
      uVar35 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _8_8_;
      findFallback((Split *)&left,this,(SetMB *)&local_1b08.field_1);
      lVar42 = local_640;
      local_1a68 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_;
      uStack_1a60 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._8_8_;
      local_1a58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      local_1a48 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      uStack_1a40 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._8_8_;
      uStack_1a38 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._0_8_;
      uStack_1a30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar49 = local_8c8[uVar56];
      if (local_1b78 == *pBVar49) {
        pBVar49[1] = (BBox1f)((long)pBVar49[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar42 * 2 + -1] = local_1b78;
        local_838[lVar42 * 2].lower = 1.4013e-45;
        local_838[lVar42 * 2].upper = 0.0;
        local_8c8[uVar56] = local_838 + lVar42 * 2 + -1;
      }
      lVar42 = local_640;
      if (local_1a78 == *pBVar49) {
        local_8c8[local_848] = pBVar49;
        pBVar49[1] = (BBox1f)((long)pBVar49[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar42 * 2 + -1] = local_1a78;
        local_838[lVar42 * 2].lower = 1.4013e-45;
        local_838[lVar42 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar42 * 2 + -1;
      }
      pBVar18 = pBVar49 + 1;
      *pBVar18 = (BBox1f)((long)*pBVar18 + -1);
      if ((*pBVar18 == (BBox1f)0x0) && (BVar11 = *pBVar49, BVar11 != (BBox1f)0x0)) {
        lVar42 = *(undefined8 *)((long)BVar11 + 0x18);
        pvVar43 = *(void **)((long)BVar11 + 0x20);
        if (pvVar43 != (void *)0x0) {
          if ((ulong)(lVar42 * 0x50) < 0x1c00000) {
            alignedFree(pvVar43);
          }
          else {
            os_free(pvVar43,lVar42 * 0x50,*(bool *)((long)BVar11 + 8));
          }
        }
        if (lVar42 != 0) {
          (**(code **)**(undefined8 **)BVar11)(*(undefined8 **)BVar11,lVar42 * -0x50,1);
        }
        *(undefined8 *)((long)BVar11 + 0x10) = 0;
        *(undefined8 *)((long)BVar11 + 0x18) = 0;
        *(undefined8 *)((long)BVar11 + 0x20) = 0;
        operator_delete((void *)BVar11);
      }
      uVar53 = local_848;
      auVar61 = auStack_1a88;
      VVar34.field_0 =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      *(undefined8 *)((long)&lbbox + lVar41) = lbbox_1.bounds0.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x10) = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x18) = lbbox_1.bounds0.upper.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x20) = lbbox_1.bounds1.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x28) = lbbox_1.bounds1.lower.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x30) = lbbox_1.bounds1.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x38) = lbbox_1.bounds1.upper.field_0._8_8_;
      ((BBox1f *)(local_1788 + uVar56 * 0xf0))->lower = (float)aStack_1bd8._0_4_;
      ((BBox1f *)(local_1788 + uVar56 * 0xf0))->upper = aStack_1bd8.m128[1];
      ((BBox1f *)(local_1788 + lVar41 + 8))->lower = (float)aStack_1bd8._8_4_;
      ((BBox1f *)(local_1788 + lVar41 + 8))->upper = aStack_1bd8.m128[3];
      *(BBox1f *)(&local_1778 + uVar56 * 0xf) = local_1bc8;
      *(size_t *)((long)&local_1778 + lVar41 + 8) = sStack_1bc0;
      *(size_t *)(local_1768 + uVar56 * 0xf0) = sStack_1bb8;
      *(BBox1f *)(local_1768 + lVar41 + 8) = BStack_1bb0;
      local_1758[uVar56 * 0x1e] = local_1ba8;
      local_1758[uVar56 * 0x1e + 1] = BStack_1ba0;
      asStack_1748[uVar56 * 0x1e] = sStack_1b98;
      asStack_1748[uVar56 * 0x1e + 1] = sStack_1b90;
      (&local_1738)[uVar56 * 0x1e].lower = (float)auStack_1b88._0_4_;
      (&local_1738)[uVar56 * 0x1e].upper = (float)auStack_1b88._4_4_;
      local_1728[uVar56 * 0x1e + -1].lower = (float)auStack_1b88._8_4_;
      local_1728[uVar56 * 0x1e + -1].upper = (float)auStack_1b88._12_4_;
      *(BBox1f *)&local_1728[uVar56 * 0x1e].lower = local_1b78;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           (undefined4)uVar6;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           SUB84(uVar6,4);
      pSVar2->sah = (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0._0_4_;
      pSVar2->dim = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._4_4_;
      *(undefined8 *)((long)local_1718 + lVar41 + 8) = uVar21;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x10) = uVar22;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x20) = uVar23;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x28) = uVar24;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x30) = uVar25;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x38) = uVar35;
      lVar41 = local_848 * 0xf0;
      *(undefined8 *)((long)&lbbox + lVar41) = local_1b18._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x10) = local_1b08._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x18) = local_1b08._8_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x20) = aStack_1af8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x28) = aStack_1af8._8_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x30) = local_1ae8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar41 + 0x38) = local_1ae8._8_8_;
      *(undefined8 *)(local_1788 + uVar53 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1788 + lVar41 + 8) = uStack_1ad0;
      *(undefined8 *)(&local_1778 + uVar53 * 0xf) = local_1ac8;
      *(undefined8 *)((long)&local_1778 + lVar41 + 8) = uStack_1ac0;
      *(undefined8 *)(local_1768 + uVar53 * 0xf0) = uStack_1ab8;
      *(undefined8 *)(local_1768 + lVar41 + 8) = uStack_1ab0;
      local_1758[uVar53 * 0x1e] = local_1aa8;
      local_1758[uVar53 * 0x1e + 1] = BStack_1aa0;
      asStack_1748[uVar53 * 0x1e] = sStack_1a98;
      asStack_1748[uVar53 * 0x1e + 1] = sStack_1a90;
      (&local_1738)[uVar53 * 0x1e].lower = (float)auStack_1a88._0_4_;
      (&local_1738)[uVar53 * 0x1e].upper = (float)auStack_1a88._4_4_;
      local_1728[uVar53 * 0x1e + -1].lower = (float)auStack_1a88._8_4_;
      local_1728[uVar53 * 0x1e + -1].upper = (float)auStack_1a88._12_4_;
      local_1728[uVar53 * 0x1e] = local_1a78;
      *(undefined8 *)((long)local_1718 + lVar41) = local_1a68;
      *(undefined8 *)((long)local_1718 + lVar41 + 8) = uStack_1a60;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x10) = local_1a58;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x20) = local_1a48;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x28) = uStack_1a40;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x30) = uStack_1a38;
      *(undefined8 *)((long)local_1718 + lVar41 + 0x38) = uStack_1a30;
      local_848 = local_848 + 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           VVar34.field_0;
      auStack_1a88 = auVar61;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar39 = bVar39 | bVar57;
      auStack_1b88 = auVar59;
    }
  } while ((uVar56 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar50 = &uStack_172c;
    uVar44 = local_848;
    do {
      auVar59 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar50[-1]),1);
      auVar61 = vcmpps_avx(ZEXT416(*puVar50),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar59 = vorps_avx(auVar59,auVar61);
      bVar39 = bVar39 | auVar59[0];
      puVar50 = puVar50 + 0x3c;
      uVar44 = uVar44 - 1;
    } while (uVar44 != 0);
  }
  if ((bVar39 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar15 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar15->alloc)._M_b._M_p) {
      local_1b18._8_1_ = 1;
      local_1b18._0_8_ = pTVar15;
      MutexSys::lock(&pTVar15->mutex);
      if ((pTVar15->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar15->alloc1).bytesUsed + (pTVar15->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar15->alloc0).end + (pTVar15->alloc1).end) -
             ((pTVar15->alloc0).cur + (pTVar15->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar15->alloc1).bytesWasted + (pTVar15->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar15->alloc0).end = auVar63._0_8_;
      (pTVar15->alloc0).allocBlockSize = auVar63._8_8_;
      (pTVar15->alloc0).bytesUsed = auVar63._16_8_;
      (pTVar15->alloc0).bytesWasted = auVar63._24_8_;
      (pTVar15->alloc0).ptr = (char *)auVar63._0_8_;
      (pTVar15->alloc0).cur = auVar63._8_8_;
      (pTVar15->alloc0).end = auVar63._16_8_;
      (pTVar15->alloc0).allocBlockSize = auVar63._24_8_;
      auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar15->alloc1).end = auVar63._0_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar15->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar15->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar15->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar15->alloc1).cur = auVar63._8_8_;
        (pTVar15->alloc1).end = auVar63._16_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._24_8_;
      }
      else {
        (pTVar15->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar15->alloc1).ptr = (char *)auVar63._0_8_;
        (pTVar15->alloc1).cur = auVar63._8_8_;
        (pTVar15->alloc1).end = auVar63._16_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._24_8_;
        (pTVar15->alloc1).end = auVar63._0_8_;
        (pTVar15->alloc1).allocBlockSize = auVar63._8_8_;
        (pTVar15->alloc1).bytesUsed = auVar63._16_8_;
        (pTVar15->alloc1).bytesWasted = auVar63._24_8_;
        (pTVar15->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar15->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar15;
      lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox_1.bounds0.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar16._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar16._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar16,(ThreadLocal2 **)&left);
      }
      else {
        *iVar16._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
      }
      if (local_1b18._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b18._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar46 = (alloc.talloc0)->cur;
    uVar44 = (ulong)(-(int)sVar46 & 0x1f);
    uVar56 = sVar46 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar44;
    (alloc.talloc0)->cur = uVar56;
    if ((alloc.talloc0)->end < uVar56) {
      (alloc.talloc0)->cur = sVar46;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar52;
        sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar46;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
          (alloc.talloc0)->ptr = pcVar52;
          sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar46;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar52 = (char *)0x0;
            goto LAB_0145467d;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar46;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar44;
      pcVar52 = (alloc.talloc0)->ptr +
                (uVar56 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_0145467d:
    pcVar52[0xc0] = '\0';
    pcVar52[0xc1] = '\0';
    pcVar52[0xc2] = -0x80;
    pcVar52[0xc3] = '\x7f';
    pcVar52[0xc4] = '\0';
    pcVar52[0xc5] = '\0';
    pcVar52[0xc6] = -0x80;
    pcVar52[199] = '\x7f';
    pcVar52[200] = '\0';
    pcVar52[0xc9] = '\0';
    pcVar52[0xca] = -0x80;
    pcVar52[0xcb] = '\x7f';
    pcVar52[0xcc] = '\0';
    pcVar52[0xcd] = '\0';
    pcVar52[0xce] = -0x80;
    pcVar52[0xcf] = '\x7f';
    pcVar52[0xd0] = '\0';
    pcVar52[0xd1] = '\0';
    pcVar52[0xd2] = -0x80;
    pcVar52[0xd3] = '\x7f';
    pcVar52[0xd4] = '\0';
    pcVar52[0xd5] = '\0';
    pcVar52[0xd6] = -0x80;
    pcVar52[0xd7] = '\x7f';
    pcVar52[0xd8] = '\0';
    pcVar52[0xd9] = '\0';
    pcVar52[0xda] = -0x80;
    pcVar52[0xdb] = '\x7f';
    pcVar52[0xdc] = '\0';
    pcVar52[0xdd] = '\0';
    pcVar52[0xde] = -0x80;
    pcVar52[0xdf] = '\x7f';
    pcVar52[0x80] = '\0';
    pcVar52[0x81] = '\0';
    pcVar52[0x82] = -0x80;
    pcVar52[0x83] = '\x7f';
    pcVar52[0x84] = '\0';
    pcVar52[0x85] = '\0';
    pcVar52[0x86] = -0x80;
    pcVar52[0x87] = '\x7f';
    pcVar52[0x88] = '\0';
    pcVar52[0x89] = '\0';
    pcVar52[0x8a] = -0x80;
    pcVar52[0x8b] = '\x7f';
    pcVar52[0x8c] = '\0';
    pcVar52[0x8d] = '\0';
    pcVar52[0x8e] = -0x80;
    pcVar52[0x8f] = '\x7f';
    pcVar52[0x90] = '\0';
    pcVar52[0x91] = '\0';
    pcVar52[0x92] = -0x80;
    pcVar52[0x93] = '\x7f';
    pcVar52[0x94] = '\0';
    pcVar52[0x95] = '\0';
    pcVar52[0x96] = -0x80;
    pcVar52[0x97] = '\x7f';
    pcVar52[0x98] = '\0';
    pcVar52[0x99] = '\0';
    pcVar52[0x9a] = -0x80;
    pcVar52[0x9b] = '\x7f';
    pcVar52[0x9c] = '\0';
    pcVar52[0x9d] = '\0';
    pcVar52[0x9e] = -0x80;
    pcVar52[0x9f] = '\x7f';
    pcVar52[0x40] = '\0';
    pcVar52[0x41] = '\0';
    pcVar52[0x42] = -0x80;
    pcVar52[0x43] = '\x7f';
    pcVar52[0x44] = '\0';
    pcVar52[0x45] = '\0';
    pcVar52[0x46] = -0x80;
    pcVar52[0x47] = '\x7f';
    pcVar52[0x48] = '\0';
    pcVar52[0x49] = '\0';
    pcVar52[0x4a] = -0x80;
    pcVar52[0x4b] = '\x7f';
    pcVar52[0x4c] = '\0';
    pcVar52[0x4d] = '\0';
    pcVar52[0x4e] = -0x80;
    pcVar52[0x4f] = '\x7f';
    pcVar52[0x50] = '\0';
    pcVar52[0x51] = '\0';
    pcVar52[0x52] = -0x80;
    pcVar52[0x53] = '\x7f';
    pcVar52[0x54] = '\0';
    pcVar52[0x55] = '\0';
    pcVar52[0x56] = -0x80;
    pcVar52[0x57] = '\x7f';
    pcVar52[0x58] = '\0';
    pcVar52[0x59] = '\0';
    pcVar52[0x5a] = -0x80;
    pcVar52[0x5b] = '\x7f';
    pcVar52[0x5c] = '\0';
    pcVar52[0x5d] = '\0';
    pcVar52[0x5e] = -0x80;
    pcVar52[0x5f] = '\x7f';
    pcVar52[0xe0] = '\0';
    pcVar52[0xe1] = '\0';
    pcVar52[0xe2] = -0x80;
    pcVar52[0xe3] = -1;
    pcVar52[0xe4] = '\0';
    pcVar52[0xe5] = '\0';
    pcVar52[0xe6] = -0x80;
    pcVar52[0xe7] = -1;
    pcVar52[0xe8] = '\0';
    pcVar52[0xe9] = '\0';
    pcVar52[0xea] = -0x80;
    pcVar52[0xeb] = -1;
    pcVar52[0xec] = '\0';
    pcVar52[0xed] = '\0';
    pcVar52[0xee] = -0x80;
    pcVar52[0xef] = -1;
    pcVar52[0xf0] = '\0';
    pcVar52[0xf1] = '\0';
    pcVar52[0xf2] = -0x80;
    pcVar52[0xf3] = -1;
    pcVar52[0xf4] = '\0';
    pcVar52[0xf5] = '\0';
    pcVar52[0xf6] = -0x80;
    pcVar52[0xf7] = -1;
    pcVar52[0xf8] = '\0';
    pcVar52[0xf9] = '\0';
    pcVar52[0xfa] = -0x80;
    pcVar52[0xfb] = -1;
    pcVar52[0xfc] = '\0';
    pcVar52[0xfd] = '\0';
    pcVar52[0xfe] = -0x80;
    pcVar52[0xff] = -1;
    pcVar52[0xa0] = '\0';
    pcVar52[0xa1] = '\0';
    pcVar52[0xa2] = -0x80;
    pcVar52[0xa3] = -1;
    pcVar52[0xa4] = '\0';
    pcVar52[0xa5] = '\0';
    pcVar52[0xa6] = -0x80;
    pcVar52[0xa7] = -1;
    pcVar52[0xa8] = '\0';
    pcVar52[0xa9] = '\0';
    pcVar52[0xaa] = -0x80;
    pcVar52[0xab] = -1;
    pcVar52[0xac] = '\0';
    pcVar52[0xad] = '\0';
    pcVar52[0xae] = -0x80;
    pcVar52[0xaf] = -1;
    pcVar52[0xb0] = '\0';
    pcVar52[0xb1] = '\0';
    pcVar52[0xb2] = -0x80;
    pcVar52[0xb3] = -1;
    pcVar52[0xb4] = '\0';
    pcVar52[0xb5] = '\0';
    pcVar52[0xb6] = -0x80;
    pcVar52[0xb7] = -1;
    pcVar52[0xb8] = '\0';
    pcVar52[0xb9] = '\0';
    pcVar52[0xba] = -0x80;
    pcVar52[0xbb] = -1;
    pcVar52[0xbc] = '\0';
    pcVar52[0xbd] = '\0';
    pcVar52[0xbe] = -0x80;
    pcVar52[0xbf] = -1;
    pcVar52[0x60] = '\0';
    pcVar52[0x61] = '\0';
    pcVar52[0x62] = -0x80;
    pcVar52[99] = -1;
    pcVar52[100] = '\0';
    pcVar52[0x65] = '\0';
    pcVar52[0x66] = -0x80;
    pcVar52[0x67] = -1;
    pcVar52[0x68] = '\0';
    pcVar52[0x69] = '\0';
    pcVar52[0x6a] = -0x80;
    pcVar52[0x6b] = -1;
    pcVar52[0x6c] = '\0';
    pcVar52[0x6d] = '\0';
    pcVar52[0x6e] = -0x80;
    pcVar52[0x6f] = -1;
    pcVar52[0x70] = '\0';
    pcVar52[0x71] = '\0';
    pcVar52[0x72] = -0x80;
    pcVar52[0x73] = -1;
    pcVar52[0x74] = '\0';
    pcVar52[0x75] = '\0';
    pcVar52[0x76] = -0x80;
    pcVar52[0x77] = -1;
    pcVar52[0x78] = '\0';
    pcVar52[0x79] = '\0';
    pcVar52[0x7a] = -0x80;
    pcVar52[0x7b] = -1;
    pcVar52[0x7c] = '\0';
    pcVar52[0x7d] = '\0';
    pcVar52[0x7e] = -0x80;
    pcVar52[0x7f] = -1;
    auVar63 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar52 + 0x100) = auVar63;
    *(undefined1 (*) [32])(pcVar52 + 0x120) = auVar63;
    auVar63 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar52 + 0x140) = auVar63;
    *(undefined1 (*) [32])(pcVar52 + 0x160) = auVar63;
    *(undefined1 (*) [32])(pcVar52 + 0x180) = auVar63;
    *(undefined1 (*) [32])(pcVar52 + 0x1a0) = auVar63;
    lVar41 = 0;
    do {
      pcVar3 = pcVar52 + lVar41 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\b';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x10] = '\b';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\b';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = '\0';
      pcVar3[0x1d] = '\0';
      pcVar3[0x1e] = '\0';
      pcVar3[0x1f] = '\0';
      lVar41 = lVar41 + 4;
    } while (lVar41 != 8);
    uVar44 = 1;
    goto LAB_0145470c;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar15 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar15->alloc)._M_b._M_p) {
    local_1b18._8_1_ = 1;
    local_1b18._0_8_ = pTVar15;
    MutexSys::lock(&pTVar15->mutex);
    if ((pTVar15->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar15->alloc1).bytesUsed + (pTVar15->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar15->alloc0).end + (pTVar15->alloc1).end) -
           ((pTVar15->alloc0).cur + (pTVar15->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar15->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar15->alloc1).bytesWasted + (pTVar15->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar15->alloc0).end = auVar63._0_8_;
    (pTVar15->alloc0).allocBlockSize = auVar63._8_8_;
    (pTVar15->alloc0).bytesUsed = auVar63._16_8_;
    (pTVar15->alloc0).bytesWasted = auVar63._24_8_;
    (pTVar15->alloc0).ptr = (char *)auVar63._0_8_;
    (pTVar15->alloc0).cur = auVar63._8_8_;
    (pTVar15->alloc0).end = auVar63._16_8_;
    (pTVar15->alloc0).allocBlockSize = auVar63._24_8_;
    auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar15->alloc1).end = auVar63._0_8_;
      (pTVar15->alloc1).allocBlockSize = auVar63._8_8_;
      (pTVar15->alloc1).bytesUsed = auVar63._16_8_;
      (pTVar15->alloc1).bytesWasted = auVar63._24_8_;
      (pTVar15->alloc1).ptr = (char *)auVar63._0_8_;
      (pTVar15->alloc1).cur = auVar63._8_8_;
      (pTVar15->alloc1).end = auVar63._16_8_;
      (pTVar15->alloc1).allocBlockSize = auVar63._24_8_;
    }
    else {
      (pTVar15->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar15->alloc1).ptr = (char *)auVar63._0_8_;
      (pTVar15->alloc1).cur = auVar63._8_8_;
      (pTVar15->alloc1).end = auVar63._16_8_;
      (pTVar15->alloc1).allocBlockSize = auVar63._24_8_;
      (pTVar15->alloc1).end = auVar63._0_8_;
      (pTVar15->alloc1).allocBlockSize = auVar63._8_8_;
      (pTVar15->alloc1).bytesUsed = auVar63._16_8_;
      (pTVar15->alloc1).bytesWasted = auVar63._24_8_;
      (pTVar15->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar15->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar15;
    lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    lbbox_1.bounds0.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar16._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar16._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar16,(ThreadLocal2 **)&left);
    }
    else {
      *iVar16._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
    }
    if (local_1b18._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b18._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar46 = (alloc.talloc0)->cur;
  uVar44 = (ulong)(-(int)sVar46 & 0x1f);
  uVar56 = sVar46 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar44;
  (alloc.talloc0)->cur = uVar56;
  if ((alloc.talloc0)->end < uVar56) {
    (alloc.talloc0)->cur = sVar46;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
      (alloc.talloc0)->ptr = pcVar52;
      sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar46;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar52 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar52;
        sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar46;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar52 = (char *)0x0;
          goto LAB_0145455f;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar46;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar44;
    pcVar52 = (alloc.talloc0)->ptr +
              (uVar56 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_0145455f:
  pcVar52[0x1c0] = '\0';
  pcVar52[0x1c1] = '\0';
  pcVar52[0x1c2] = -0x80;
  pcVar52[0x1c3] = '\x7f';
  pcVar52[0x1c4] = '\0';
  pcVar52[0x1c5] = '\0';
  pcVar52[0x1c6] = -0x80;
  pcVar52[0x1c7] = '\x7f';
  pcVar52[0x1c8] = '\0';
  pcVar52[0x1c9] = '\0';
  pcVar52[0x1ca] = -0x80;
  pcVar52[0x1cb] = '\x7f';
  pcVar52[0x1cc] = '\0';
  pcVar52[0x1cd] = '\0';
  pcVar52[0x1ce] = -0x80;
  pcVar52[0x1cf] = '\x7f';
  pcVar52[0x1d0] = '\0';
  pcVar52[0x1d1] = '\0';
  pcVar52[0x1d2] = -0x80;
  pcVar52[0x1d3] = '\x7f';
  pcVar52[0x1d4] = '\0';
  pcVar52[0x1d5] = '\0';
  pcVar52[0x1d6] = -0x80;
  pcVar52[0x1d7] = '\x7f';
  pcVar52[0x1d8] = '\0';
  pcVar52[0x1d9] = '\0';
  pcVar52[0x1da] = -0x80;
  pcVar52[0x1db] = '\x7f';
  pcVar52[0x1dc] = '\0';
  pcVar52[0x1dd] = '\0';
  pcVar52[0x1de] = -0x80;
  pcVar52[0x1df] = '\x7f';
  pcVar52[0x1e0] = '\0';
  pcVar52[0x1e1] = '\0';
  pcVar52[0x1e2] = -0x80;
  pcVar52[0x1e3] = -1;
  pcVar52[0x1e4] = '\0';
  pcVar52[0x1e5] = '\0';
  pcVar52[0x1e6] = -0x80;
  pcVar52[0x1e7] = -1;
  pcVar52[0x1e8] = '\0';
  pcVar52[0x1e9] = '\0';
  pcVar52[0x1ea] = -0x80;
  pcVar52[0x1eb] = -1;
  pcVar52[0x1ec] = '\0';
  pcVar52[0x1ed] = '\0';
  pcVar52[0x1ee] = -0x80;
  pcVar52[0x1ef] = -1;
  pcVar52[0x1f0] = '\0';
  pcVar52[0x1f1] = '\0';
  pcVar52[0x1f2] = -0x80;
  pcVar52[499] = -1;
  pcVar52[500] = '\0';
  pcVar52[0x1f5] = '\0';
  pcVar52[0x1f6] = -0x80;
  pcVar52[0x1f7] = -1;
  pcVar52[0x1f8] = '\0';
  pcVar52[0x1f9] = '\0';
  pcVar52[0x1fa] = -0x80;
  pcVar52[0x1fb] = -1;
  pcVar52[0x1fc] = '\0';
  pcVar52[0x1fd] = '\0';
  pcVar52[0x1fe] = -0x80;
  pcVar52[0x1ff] = -1;
  pcVar52[0xc0] = '\0';
  pcVar52[0xc1] = '\0';
  pcVar52[0xc2] = -0x80;
  pcVar52[0xc3] = '\x7f';
  pcVar52[0xc4] = '\0';
  pcVar52[0xc5] = '\0';
  pcVar52[0xc6] = -0x80;
  pcVar52[199] = '\x7f';
  pcVar52[200] = '\0';
  pcVar52[0xc9] = '\0';
  pcVar52[0xca] = -0x80;
  pcVar52[0xcb] = '\x7f';
  pcVar52[0xcc] = '\0';
  pcVar52[0xcd] = '\0';
  pcVar52[0xce] = -0x80;
  pcVar52[0xcf] = '\x7f';
  pcVar52[0xd0] = '\0';
  pcVar52[0xd1] = '\0';
  pcVar52[0xd2] = -0x80;
  pcVar52[0xd3] = '\x7f';
  pcVar52[0xd4] = '\0';
  pcVar52[0xd5] = '\0';
  pcVar52[0xd6] = -0x80;
  pcVar52[0xd7] = '\x7f';
  pcVar52[0xd8] = '\0';
  pcVar52[0xd9] = '\0';
  pcVar52[0xda] = -0x80;
  pcVar52[0xdb] = '\x7f';
  pcVar52[0xdc] = '\0';
  pcVar52[0xdd] = '\0';
  pcVar52[0xde] = -0x80;
  pcVar52[0xdf] = '\x7f';
  pcVar52[0x80] = '\0';
  pcVar52[0x81] = '\0';
  pcVar52[0x82] = -0x80;
  pcVar52[0x83] = '\x7f';
  pcVar52[0x84] = '\0';
  pcVar52[0x85] = '\0';
  pcVar52[0x86] = -0x80;
  pcVar52[0x87] = '\x7f';
  pcVar52[0x88] = '\0';
  pcVar52[0x89] = '\0';
  pcVar52[0x8a] = -0x80;
  pcVar52[0x8b] = '\x7f';
  pcVar52[0x8c] = '\0';
  pcVar52[0x8d] = '\0';
  pcVar52[0x8e] = -0x80;
  pcVar52[0x8f] = '\x7f';
  pcVar52[0x90] = '\0';
  pcVar52[0x91] = '\0';
  pcVar52[0x92] = -0x80;
  pcVar52[0x93] = '\x7f';
  pcVar52[0x94] = '\0';
  pcVar52[0x95] = '\0';
  pcVar52[0x96] = -0x80;
  pcVar52[0x97] = '\x7f';
  pcVar52[0x98] = '\0';
  pcVar52[0x99] = '\0';
  pcVar52[0x9a] = -0x80;
  pcVar52[0x9b] = '\x7f';
  pcVar52[0x9c] = '\0';
  pcVar52[0x9d] = '\0';
  pcVar52[0x9e] = -0x80;
  pcVar52[0x9f] = '\x7f';
  pcVar52[0x40] = '\0';
  pcVar52[0x41] = '\0';
  pcVar52[0x42] = -0x80;
  pcVar52[0x43] = '\x7f';
  pcVar52[0x44] = '\0';
  pcVar52[0x45] = '\0';
  pcVar52[0x46] = -0x80;
  pcVar52[0x47] = '\x7f';
  pcVar52[0x48] = '\0';
  pcVar52[0x49] = '\0';
  pcVar52[0x4a] = -0x80;
  pcVar52[0x4b] = '\x7f';
  pcVar52[0x4c] = '\0';
  pcVar52[0x4d] = '\0';
  pcVar52[0x4e] = -0x80;
  pcVar52[0x4f] = '\x7f';
  pcVar52[0x50] = '\0';
  pcVar52[0x51] = '\0';
  pcVar52[0x52] = -0x80;
  pcVar52[0x53] = '\x7f';
  pcVar52[0x54] = '\0';
  pcVar52[0x55] = '\0';
  pcVar52[0x56] = -0x80;
  pcVar52[0x57] = '\x7f';
  pcVar52[0x58] = '\0';
  pcVar52[0x59] = '\0';
  pcVar52[0x5a] = -0x80;
  pcVar52[0x5b] = '\x7f';
  pcVar52[0x5c] = '\0';
  pcVar52[0x5d] = '\0';
  pcVar52[0x5e] = -0x80;
  pcVar52[0x5f] = '\x7f';
  pcVar52[0xe0] = '\0';
  pcVar52[0xe1] = '\0';
  pcVar52[0xe2] = -0x80;
  pcVar52[0xe3] = -1;
  pcVar52[0xe4] = '\0';
  pcVar52[0xe5] = '\0';
  pcVar52[0xe6] = -0x80;
  pcVar52[0xe7] = -1;
  pcVar52[0xe8] = '\0';
  pcVar52[0xe9] = '\0';
  pcVar52[0xea] = -0x80;
  pcVar52[0xeb] = -1;
  pcVar52[0xec] = '\0';
  pcVar52[0xed] = '\0';
  pcVar52[0xee] = -0x80;
  pcVar52[0xef] = -1;
  pcVar52[0xf0] = '\0';
  pcVar52[0xf1] = '\0';
  pcVar52[0xf2] = -0x80;
  pcVar52[0xf3] = -1;
  pcVar52[0xf4] = '\0';
  pcVar52[0xf5] = '\0';
  pcVar52[0xf6] = -0x80;
  pcVar52[0xf7] = -1;
  pcVar52[0xf8] = '\0';
  pcVar52[0xf9] = '\0';
  pcVar52[0xfa] = -0x80;
  pcVar52[0xfb] = -1;
  pcVar52[0xfc] = '\0';
  pcVar52[0xfd] = '\0';
  pcVar52[0xfe] = -0x80;
  pcVar52[0xff] = -1;
  pcVar52[0xa0] = '\0';
  pcVar52[0xa1] = '\0';
  pcVar52[0xa2] = -0x80;
  pcVar52[0xa3] = -1;
  pcVar52[0xa4] = '\0';
  pcVar52[0xa5] = '\0';
  pcVar52[0xa6] = -0x80;
  pcVar52[0xa7] = -1;
  pcVar52[0xa8] = '\0';
  pcVar52[0xa9] = '\0';
  pcVar52[0xaa] = -0x80;
  pcVar52[0xab] = -1;
  pcVar52[0xac] = '\0';
  pcVar52[0xad] = '\0';
  pcVar52[0xae] = -0x80;
  pcVar52[0xaf] = -1;
  pcVar52[0xb0] = '\0';
  pcVar52[0xb1] = '\0';
  pcVar52[0xb2] = -0x80;
  pcVar52[0xb3] = -1;
  pcVar52[0xb4] = '\0';
  pcVar52[0xb5] = '\0';
  pcVar52[0xb6] = -0x80;
  pcVar52[0xb7] = -1;
  pcVar52[0xb8] = '\0';
  pcVar52[0xb9] = '\0';
  pcVar52[0xba] = -0x80;
  pcVar52[0xbb] = -1;
  pcVar52[0xbc] = '\0';
  pcVar52[0xbd] = '\0';
  pcVar52[0xbe] = -0x80;
  pcVar52[0xbf] = -1;
  pcVar52[0x60] = '\0';
  pcVar52[0x61] = '\0';
  pcVar52[0x62] = -0x80;
  pcVar52[99] = -1;
  pcVar52[100] = '\0';
  pcVar52[0x65] = '\0';
  pcVar52[0x66] = -0x80;
  pcVar52[0x67] = -1;
  pcVar52[0x68] = '\0';
  pcVar52[0x69] = '\0';
  pcVar52[0x6a] = -0x80;
  pcVar52[0x6b] = -1;
  pcVar52[0x6c] = '\0';
  pcVar52[0x6d] = '\0';
  pcVar52[0x6e] = -0x80;
  pcVar52[0x6f] = -1;
  pcVar52[0x70] = '\0';
  pcVar52[0x71] = '\0';
  pcVar52[0x72] = -0x80;
  pcVar52[0x73] = -1;
  pcVar52[0x74] = '\0';
  pcVar52[0x75] = '\0';
  pcVar52[0x76] = -0x80;
  pcVar52[0x77] = -1;
  pcVar52[0x78] = '\0';
  pcVar52[0x79] = '\0';
  pcVar52[0x7a] = -0x80;
  pcVar52[0x7b] = -1;
  pcVar52[0x7c] = '\0';
  pcVar52[0x7d] = '\0';
  pcVar52[0x7e] = -0x80;
  pcVar52[0x7f] = -1;
  auVar63 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar52 + 0x100) = auVar63;
  *(undefined1 (*) [32])(pcVar52 + 0x120) = auVar63;
  auVar63 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar52 + 0x140) = auVar63;
  *(undefined1 (*) [32])(pcVar52 + 0x160) = auVar63;
  *(undefined1 (*) [32])(pcVar52 + 0x180) = auVar63;
  *(undefined1 (*) [32])(pcVar52 + 0x1a0) = auVar63;
  lVar41 = 0;
  do {
    pcVar3 = pcVar52 + lVar41 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\b';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\b';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    lVar41 = lVar41 + 4;
  } while (lVar41 != 8);
  uVar44 = 6;
LAB_0145470c:
  local_1e08._8_4_ = 0xff800000;
  local_1e08._0_8_ = 0xff800000ff800000;
  local_1e08._12_4_ = 0xff800000;
  local_1df8._8_4_ = 0x7f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  local_1df8._12_4_ = 0x7f800000;
  in_00 = (BuildRecord *)&lbbox;
  if (local_848 != 0) {
    pBVar49 = &values[0].dt;
    uVar56 = 0;
    local_1df8._8_4_ = 0x7f800000;
    local_1df8._0_8_ = 0x7f8000007f800000;
    local_1df8._12_4_ = 0x7f800000;
    local_1db8._8_4_ = 0x7f800000;
    local_1db8._0_8_ = 0x7f8000007f800000;
    local_1db8._12_4_ = 0x7f800000;
    local_1e08._8_4_ = 0xff800000;
    local_1e08._0_8_ = 0xff800000ff800000;
    local_1e08._12_4_ = 0xff800000;
    local_1dc8._8_4_ = 0xff800000;
    local_1dc8._0_8_ = 0xff800000ff800000;
    local_1dc8._12_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&lbbox_1,this,in_00,alloc);
      pBVar49[-10].lower = (float)lbbox_1.bounds0.lower.field_0._0_4_;
      pBVar49[-10].upper = (float)lbbox_1.bounds0.lower.field_0._4_4_;
      auVar27._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
      auVar27._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar49 + -8) = auVar27;
      pBVar49[-6].lower = (float)lbbox_1.bounds1.lower.field_0._0_4_;
      pBVar49[-6].upper = (float)lbbox_1.bounds1.lower.field_0._4_4_;
      pBVar49[-5].lower = (float)lbbox_1.bounds1.lower.field_0._8_4_;
      pBVar49[-5].upper = (float)lbbox_1.bounds1.lower.field_0._12_4_;
      pBVar49[-4].lower = (float)lbbox_1.bounds1.upper.field_0._0_4_;
      pBVar49[-4].upper = (float)lbbox_1.bounds1.upper.field_0._4_4_;
      pBVar49[-3].lower = (float)lbbox_1.bounds1.upper.field_0._8_4_;
      pBVar49[-3].upper = (float)lbbox_1.bounds1.upper.field_0._12_4_;
      pBVar49[-2].lower = (float)aStack_1bd8._0_4_;
      pBVar49[-2].upper = aStack_1bd8.m128[1];
      pBVar49[-1].lower = (float)aStack_1bd8._8_4_;
      pBVar49[-1].upper = aStack_1bd8.m128[3];
      *pBVar49 = local_1bc8;
      local_1e08 = vmaxps_avx(local_1e08,*(undefined1 (*) [16])(pBVar49 + -6));
      local_1db8 = vminps_avx(local_1db8,*(undefined1 (*) [16])(pBVar49 + -4));
      local_1df8 = vminps_avx(local_1df8,auVar27);
      local_1dc8 = vmaxps_avx(local_1dc8,*(undefined1 (*) [16])(pBVar49 + -2));
      uVar56 = uVar56 + 1;
      pBVar49 = pBVar49 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar56 < local_848);
  }
  uVar44 = uVar44 | (ulong)pcVar52;
  if (((uint)uVar44 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar53 = (ulong)pcVar52 & 0xfffffffffffffff0;
      pfVar45 = &values[0].dt.upper;
      uVar56 = 0;
      auVar71._8_4_ = 0x7f7fffff;
      auVar71._0_8_ = 0x7f7fffff7f7fffff;
      auVar71._12_4_ = 0x7f7fffff;
      auVar75._8_4_ = 0xff7fffff;
      auVar75._0_8_ = 0xff7fffffff7fffff;
      auVar75._12_4_ = 0xff7fffff;
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar53 + uVar56 * 8) = *(undefined8 *)(pfVar45 + -0x15);
        fVar5 = ((BBox1f *)(pfVar45 + -1))->lower;
        fVar81 = 1.0 / (*pfVar45 - fVar5);
        fVar20 = -fVar5 * fVar81;
        auVar59 = vshufps_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),0);
        auVar61 = vshufps_avx(ZEXT416((uint)(1.0 - fVar20)),ZEXT416((uint)(1.0 - fVar20)),0);
        auVar89._0_4_ = pfVar45[-9] * auVar59._0_4_ + pfVar45[-0x11] * auVar61._0_4_;
        auVar89._4_4_ = pfVar45[-8] * auVar59._4_4_ + pfVar45[-0x10] * auVar61._4_4_;
        auVar89._8_4_ = pfVar45[-7] * auVar59._8_4_ + pfVar45[-0xf] * auVar61._8_4_;
        auVar89._12_4_ = pfVar45[-6] * auVar59._12_4_ + pfVar45[-0xe] * auVar61._12_4_;
        auVar84._0_4_ = pfVar45[-5] * auVar59._0_4_ + pfVar45[-0xd] * auVar61._0_4_;
        auVar84._4_4_ = pfVar45[-4] * auVar59._4_4_ + pfVar45[-0xc] * auVar61._4_4_;
        auVar84._8_4_ = pfVar45[-3] * auVar59._8_4_ + pfVar45[-0xb] * auVar61._8_4_;
        auVar84._12_4_ = pfVar45[-2] * auVar59._12_4_ + pfVar45[-10] * auVar61._12_4_;
        fVar81 = (1.0 - fVar5) * fVar81;
        auVar59 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
        auVar61 = vshufps_avx(ZEXT416((uint)(1.0 - fVar81)),ZEXT416((uint)(1.0 - fVar81)),0);
        auVar86._0_4_ = pfVar45[-9] * auVar59._0_4_ + pfVar45[-0x11] * auVar61._0_4_;
        auVar86._4_4_ = pfVar45[-8] * auVar59._4_4_ + pfVar45[-0x10] * auVar61._4_4_;
        auVar86._8_4_ = pfVar45[-7] * auVar59._8_4_ + pfVar45[-0xf] * auVar61._8_4_;
        auVar86._12_4_ = pfVar45[-6] * auVar59._12_4_ + pfVar45[-0xe] * auVar61._12_4_;
        auVar82._0_4_ = pfVar45[-5] * auVar59._0_4_ + pfVar45[-0xd] * auVar61._0_4_;
        auVar82._4_4_ = pfVar45[-4] * auVar59._4_4_ + pfVar45[-0xc] * auVar61._4_4_;
        auVar82._8_4_ = pfVar45[-3] * auVar59._8_4_ + pfVar45[-0xb] * auVar61._8_4_;
        auVar82._12_4_ = pfVar45[-2] * auVar59._12_4_ + pfVar45[-10] * auVar61._12_4_;
        auVar73 = vminps_avx(auVar89,auVar71);
        auVar61 = vmaxps_avx(auVar84,auVar75);
        auVar66 = vminps_avx(auVar86,auVar71);
        auVar60 = vmaxps_avx(auVar82,auVar75);
        auVar59 = vandps_avx(auVar73,auVar78);
        auVar87._0_4_ = auVar59._0_4_ * 4.7683716e-07;
        auVar87._4_4_ = auVar59._4_4_ * 4.7683716e-07;
        auVar87._8_4_ = auVar59._8_4_ * 4.7683716e-07;
        auVar87._12_4_ = auVar59._12_4_ * 4.7683716e-07;
        auVar73 = vsubps_avx(auVar73,auVar87);
        auVar59 = vandps_avx(auVar61,auVar78);
        auVar85._0_4_ = auVar61._0_4_ + auVar59._0_4_ * 4.7683716e-07;
        auVar85._4_4_ = auVar61._4_4_ + auVar59._4_4_ * 4.7683716e-07;
        auVar85._8_4_ = auVar61._8_4_ + auVar59._8_4_ * 4.7683716e-07;
        auVar85._12_4_ = auVar61._12_4_ + auVar59._12_4_ * 4.7683716e-07;
        auVar59 = vandps_avx(auVar66,auVar78);
        auVar88._0_4_ = auVar59._0_4_ * 4.7683716e-07;
        auVar88._4_4_ = auVar59._4_4_ * 4.7683716e-07;
        auVar88._8_4_ = auVar59._8_4_ * 4.7683716e-07;
        auVar88._12_4_ = auVar59._12_4_ * 4.7683716e-07;
        auVar61 = vsubps_avx(auVar66,auVar88);
        auVar59 = vandps_avx(auVar60,auVar78);
        *(int *)(uVar53 + 0x40 + uVar56 * 4) = auVar73._0_4_;
        uVar8 = vextractps_avx(auVar73,1);
        *(undefined4 *)(uVar53 + 0x80 + uVar56 * 4) = uVar8;
        auVar83._0_4_ = auVar59._0_4_ * 4.7683716e-07 + auVar60._0_4_;
        auVar83._4_4_ = auVar59._4_4_ * 4.7683716e-07 + auVar60._4_4_;
        auVar83._8_4_ = auVar59._8_4_ * 4.7683716e-07 + auVar60._8_4_;
        auVar83._12_4_ = auVar59._12_4_ * 4.7683716e-07 + auVar60._12_4_;
        uVar8 = vextractps_avx(auVar73,2);
        *(undefined4 *)(uVar53 + 0xc0 + uVar56 * 4) = uVar8;
        *(float *)(uVar53 + 0x60 + uVar56 * 4) = auVar85._0_4_;
        uVar8 = vextractps_avx(auVar85,1);
        *(undefined4 *)(uVar53 + 0xa0 + uVar56 * 4) = uVar8;
        auVar59 = vsubps_avx(auVar61,auVar73);
        uVar8 = vextractps_avx(auVar85,2);
        *(undefined4 *)(uVar53 + 0xe0 + uVar56 * 4) = uVar8;
        *(int *)(uVar53 + 0x100 + uVar56 * 4) = auVar59._0_4_;
        uVar8 = vextractps_avx(auVar59,1);
        *(undefined4 *)(uVar53 + 0x140 + uVar56 * 4) = uVar8;
        auVar61 = vsubps_avx(auVar83,auVar85);
        uVar8 = vextractps_avx(auVar59,2);
        *(undefined4 *)(uVar53 + 0x180 + uVar56 * 4) = uVar8;
        *(int *)(uVar53 + 0x120 + uVar56 * 4) = auVar61._0_4_;
        uVar8 = vextractps_avx(auVar61,1);
        *(undefined4 *)(uVar53 + 0x160 + uVar56 * 4) = uVar8;
        uVar8 = vextractps_avx(auVar61,2);
        *(undefined4 *)(uVar53 + 0x1a0 + uVar56 * 4) = uVar8;
        uVar56 = uVar56 + 1;
        pfVar45 = pfVar45 + 0x18;
      } while (local_848 != uVar56);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::InstanceArray>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::InstanceArray,embree::InstanceArrayPrimitive>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar13 = BStack_1840;
  BVar11 = local_1848;
  if ((bVar39 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar44;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1df8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e08._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1db8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1db8._8_8_;
  }
  else {
    vSplitPos.field_0.v[0] = (longlong)&local_18a8;
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    local_1b18.m128[2] = INFINITY;
    local_1b18._0_8_ = 0x7f8000007f800000;
    local_1b18.m128[3] = INFINITY;
    local_1b08.m128[2] = -INFINITY;
    local_1b08._0_8_ = 0xff800000ff800000;
    local_1b08.m128[3] = -INFINITY;
    aStack_1af8.m128 = local_1b18.m128;
    local_1ae8.m128 = local_1b08.m128;
    uVar56 = (long)BStack_1840 - (long)local_1848;
    if (uVar56 < 0xc00) {
      aVar72 = local_1b18;
      aVar77 = local_1b08;
      aVar79 = local_1b18;
      aVar76 = local_1b08;
      if ((ulong)local_1848 < (ulong)BStack_1840) {
        lVar41 = (long)local_1848 * 0x50 + 0x1c;
        aVar76.m128[2] = -INFINITY;
        aVar76._0_8_ = 0xff800000ff800000;
        aVar76.m128[3] = -INFINITY;
        aVar79.m128[2] = INFINITY;
        aVar79._0_8_ = 0x7f8000007f800000;
        aVar79.m128[3] = INFINITY;
        aVar77 = aVar76;
        aVar72 = aVar79;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             local_1b18;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 =
             local_1b08;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 =
             local_1b18;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 =
             local_1b08;
        do {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_4_ = BStack_1820.lower;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _4_4_ = BStack_1820.upper;
          uVar53 = (ulong)*(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).
                                           bounds0.lower.field_0 + lVar41);
          pIVar17 = *(InstanceArray **)
                     (*(long *)(*(long *)vSplitPos.field_0.v[1] + 0x1e8) +
                     (ulong)*(uint *)((long)*(PrimRefMB **)((long)local_1818 + 0x20) +
                                     lVar41 + -0x10) * 8);
          if ((*(long *)&(pIVar17->super_Geometry).field_0x58 != 0) ||
             (*(int *)((pIVar17->object_ids).super_RawBufferView.ptr_ofs +
                      (pIVar17->object_ids).super_RawBufferView.stride * uVar53) != -1)) {
            InstanceArray::nonlinearBounds
                      (&lbbox_1,pIVar17,uVar53,(BBox1f *)&right,
                       &(pIVar17->super_Geometry).time_range,
                       (pIVar17->super_Geometry).fnumTimeSegments);
          }
          auVar26._8_4_ = lbbox_1.bounds0.lower.field_0.m128[2];
          auVar26._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
          auVar26._12_2_ = lbbox_1.bounds0.lower.field_0._12_2_;
          auVar26._14_2_ = lbbox_1.bounds0.lower.field_0._14_2_;
          aVar72.m128 = (__m128)vminps_avx(aVar72.m128,auVar26);
          auVar28._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
          auVar28._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
          aVar77.m128 = (__m128)vmaxps_avx(aVar77.m128,auVar28);
          auVar29._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
          auVar29._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
          aVar79.m128 = (__m128)vminps_avx(aVar79.m128,auVar29);
          auVar30._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
          auVar30._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
          aVar76.m128 = (__m128)vmaxps_avx(aVar76.m128,auVar30);
          lVar41 = lVar41 + 0x50;
          uVar56 = uVar56 - 1;
        } while (uVar56 != 0);
      }
    }
    else {
      lbbox_1.bounds0.lower.field_0._12_2_ = 0x401;
      lbbox_1.bounds1.lower.field_0._0_8_ = 0;
      lbbox_1.bounds1.lower.field_0._8_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&lbbox_1);
      BVar37 = BStack_1840;
      BVar14 = local_1848;
      BStack_1840.lower = BVar13.lower;
      BStack_1840.upper = BVar13.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           BStack_1840.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           BStack_1840.upper;
      local_1848.lower = BVar11.lower;
      local_1848.upper = BVar11.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_4_ =
           local_1848.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._12_4_ =
           local_1848.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      local_1848 = BVar14;
      BStack_1840 = BVar37;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_1b18.field_1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&lbbox_1,
                 (task_group_context *)
                 new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl);
      cVar40 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&lbbox_1);
      if (cVar40 != '\0') {
        prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar48,"task cancelled");
        __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&lbbox_1);
      aVar72 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      aVar77 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0;
      aVar79 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0;
      aVar76 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0;
    }
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 = aVar76;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 = aVar79;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 = aVar77;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 = aVar72;
    (__return_storage_ptr__->ref).ptr = uVar44;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1dc8._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    local_1dc8._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dc8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dc8._8_8_;
  __return_storage_ptr__->dt = BStack_1820;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar44 = 0;
  do {
    pBVar18 = local_8c8[uVar44];
    pBVar49 = pBVar18 + 1;
    *pBVar49 = (BBox1f)((long)*pBVar49 + -1);
    if ((*pBVar49 == (BBox1f)0x0) && (BVar11 = *pBVar18, BVar11 != (BBox1f)0x0)) {
      lVar41 = *(undefined8 *)((long)BVar11 + 0x18);
      pvVar43 = *(void **)((long)BVar11 + 0x20);
      if (pvVar43 != (void *)0x0) {
        if ((ulong)(lVar41 * 0x50) < 0x1c00000) {
          alignedFree(pvVar43);
        }
        else {
          os_free(pvVar43,lVar41 * 0x50,*(bool *)((long)BVar11 + 8));
        }
      }
      if (lVar41 != 0) {
        (**(code **)**(undefined8 **)BVar11)(*(undefined8 **)BVar11,lVar41 * -0x50,1);
      }
      *(undefined8 *)((long)BVar11 + 0x10) = 0;
      *(undefined8 *)((long)BVar11 + 0x18) = 0;
      *(undefined8 *)((long)BVar11 + 0x20) = 0;
      operator_delete((void *)BVar11);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }